

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_avx_256_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  parasail_profile_t *ppVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  __m256i_32_t t;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_avx_256_32_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_avx_256_32_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar10 = _s1Len + 0xe;
    if (-1 < _s1Len + 7) {
      iVar10 = _s1Len + 7;
    }
    uVar14 = iVar10 >> 3;
    pvVar4 = parasail_memalign(0x20,(long)(int)(uVar14 * uVar2) << 5);
    if ((pvVar4 != (void *)0x0) &&
       (ppVar5 = parasail_profile_new(s1,_s1Len,matrix), ppVar5 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar6 = 1;
        if (1 < (int)uVar14) {
          uVar6 = (ulong)uVar14;
        }
        uVar9 = 0;
        lVar11 = 0;
        do {
          if (0 < _s1Len) {
            lVar11 = (long)(int)lVar11;
            iVar10 = 0;
            uVar8 = 0;
            do {
              iVar3 = matrix->type;
              lVar7 = 0;
              uVar12 = uVar8;
              iVar13 = iVar10;
              do {
                if (iVar3 == 0) {
                  if ((int)uVar12 < _s1Len) {
                    iVar15 = matrix->mapper[(byte)s1[uVar12]] + (int)uVar9 * uVar2;
                    goto LAB_007a5f6d;
                  }
LAB_007a5f7a:
                  iVar15 = 0;
                }
                else {
                  if (_s1Len <= (int)uVar12) goto LAB_007a5f7a;
                  iVar15 = matrix->mapper[(byte)matrix->alphabet[uVar9]] + iVar13;
LAB_007a5f6d:
                  iVar15 = matrix->matrix[iVar15];
                }
                *(int *)((long)&local_80 + lVar7 * 4) = iVar15;
                uVar12 = uVar12 + uVar14;
                lVar7 = lVar7 + 1;
                iVar13 = iVar13 + uVar14 * uVar2;
              } while (lVar7 != 8);
              puVar1 = (undefined8 *)((long)pvVar4 + lVar11 * 0x20);
              *puVar1 = local_80;
              puVar1[1] = uStack_78;
              puVar1[2] = uStack_70;
              puVar1[3] = uStack_68;
              lVar11 = lVar11 + 1;
              uVar8 = uVar8 + 1;
              iVar10 = iVar10 + uVar2;
            } while (uVar8 != uVar6);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
      (ppVar5->profile32).score = pvVar4;
      ppVar5->free = parasail_free___m256i;
      return ppVar5;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_avx_256_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_32_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->free = &parasail_free___m256i;
    return profile;
}